

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void lsr_56(void)

{
  ubyte uVar1;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp2 = uVar1 + x_reg;
  carry_f = RAM[temp2] & 1;
  result_f = (ubyte)((int)(uint)RAM[temp2] >> 1);
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void lsr_56(void) {
    CLE;
    result_f = RAM[temp2 = getbyte(pc) + x_reg];
    carry_f = result_f & 1;
    result_f >>= 1;
    RAM[temp2] = result_f;
    pc++;
}